

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlmdifc.c
# Opt level: O2

int main(void)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  double *pdVar4;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  double *pdVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  int ipvt [3];
  int nfev;
  fcndata_t data;
  double local_548 [4];
  double wa1 [3];
  double wa3 [3];
  double wa2 [3];
  double qtf [3];
  double diag [3];
  double y [15];
  double wa4 [15];
  double fvec [15];
  double fjac [45];
  double fjac1 [45];
  
  data.y = y;
  pdVar4 = (double *)&DAT_00104040;
  pdVar8 = data.y;
  for (lVar3 = 0xf; lVar3 != 0; lVar3 = lVar3 + -1) {
    *pdVar8 = *pdVar4;
    pdVar4 = pdVar4 + 1;
    pdVar8 = pdVar8 + 1;
  }
  data.m = 0xf;
  local_548[0] = 1.0;
  local_548[1] = 1.0;
  local_548[2] = 1.0;
  dVar10 = dpmpar(1);
  if (dVar10 < 0.0) {
    dVar10 = sqrt(dVar10);
  }
  else {
    dVar10 = SQRT(dVar10);
  }
  dVar11 = dpmpar(1);
  if (dVar11 < 0.0) {
    dVar11 = sqrt(dVar11);
  }
  else {
    dVar11 = SQRT(dVar11);
  }
  pdVar4 = fjac;
  uVar1 = lmdif(fcn,&data,0xf,3,local_548,fvec,dVar10,dVar11,0.0,800,0.0,diag,1,100.0,0,&nfev,pdVar4
                ,0xf,ipvt,qtf,wa1,wa2,wa3,wa4);
  dVar10 = enorm(0xf,fvec);
  printf("      final l2 norm of the residuals%15.7g\n\n");
  printf("      number of function evaluations%10i\n\n",(ulong)(uint)nfev);
  printf("      exit parameter                %10i\n\n",(ulong)uVar1);
  puts("      final approximate solution");
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    pcVar7 = "";
    if (lVar3 == 0) {
      pcVar7 = "\n     ";
    }
    printf("%s%15.7g",local_548[lVar3],pcVar7);
  }
  putchar(10);
  dVar11 = dpmpar(1);
  pdVar8 = fjac1;
  memcpy(pdVar8,pdVar4,0x168);
  covar(3,pdVar8,0xf,ipvt,dVar11,wa1);
  iVar2 = covar1(0xf,3,dVar10 * dVar10,pdVar4,0xf,ipvt,dVar11,wa1);
  puts("      covariance");
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
      pcVar7 = "";
      if (lVar6 == 0) {
        pcVar7 = "\n     ";
      }
      printf("%s%15.7g",pdVar4[lVar6],pcVar7);
    }
    pdVar4 = pdVar4 + 0xf;
  }
  putchar(10);
  if (iVar2 == 3) {
    pdVar4 = fjac;
    for (uVar5 = 0; uVar5 != 3; uVar5 = uVar5 + 1) {
      for (uVar9 = 0; uVar9 != 3; uVar9 = uVar9 + 1) {
        dVar11 = pdVar8[uVar9] * ((dVar10 * dVar10) / 12.0);
        if ((pdVar4[uVar9] != dVar11) || (NAN(pdVar4[uVar9]) || NAN(dVar11))) {
          printf("component (%d,%d) of covar and covar1 differ: %g != %g\n",uVar5 & 0xffffffff,
                 uVar9 & 0xffffffff);
        }
      }
      pdVar8 = pdVar8 + 0xf;
      pdVar4 = pdVar4 + 0xf;
    }
  }
  return 0;
}

Assistant:

int main()
{
#if (defined(__MINGW32__) && !defined(_UCRT)) || (defined(_MSC_VER) && (_MSC_VER < 1900))
  _set_output_format(_TWO_DIGIT_EXPONENT);
#endif
  int i, j, maxfev, mode, nprint, info, nfev, ldfjac;
  int ipvt[3];
  real ftol, xtol, gtol, epsfcn, factor, fnorm;
  real x[3], fvec[15], diag[3], fjac[15*3], qtf[3], 
    wa1[3], wa2[3], wa3[3], wa4[15];
  int k;
  const int m = 15;
  const int n = 3;
  /* auxiliary data (e.g. measurements) */
  real y[15] = {1.4e-1, 1.8e-1, 2.2e-1, 2.5e-1, 2.9e-1, 3.2e-1, 3.5e-1,
                  3.9e-1, 3.7e-1, 5.8e-1, 7.3e-1, 9.6e-1, 1.34, 2.1, 4.39};
#ifdef TEST_COVAR
  real covfac;
  real fjac1[15*3];
#endif

  fcndata_t data;
  data.m = m;
  data.y = y;

/*      the following starting values provide a rough fit. */

  x[0] = 1.;
  x[1] = 1.;
  x[2] = 1.;

  ldfjac = 15;

  /*      set ftol and xtol to the square root of the machine */
  /*      and gtol to zero. unless high solutions are */
  /*      required, these are the recommended settings. */

  ftol = sqrt(__cminpack_func__(dpmpar)(1));
  xtol = sqrt(__cminpack_func__(dpmpar)(1));
  gtol = 0.;

  maxfev = 800;
  epsfcn = 0.;
  mode = 1;
  factor = 1.e2;
  nprint = 0;

  info = __cminpack_func__(lmdif)(fcn, &data, m, n, x, fvec, ftol, xtol, gtol, maxfev, epsfcn, 
	 diag, mode, factor, nprint, &nfev, fjac, ldfjac, 
	 ipvt, qtf, wa1, wa2, wa3, wa4);

  fnorm = __cminpack_func__(enorm)(m, fvec);

  printf("      final l2 norm of the residuals%15.7g\n\n", (double)fnorm);
  printf("      number of function evaluations%10i\n\n", nfev);
  printf("      exit parameter                %10i\n\n", info);
  printf("      final approximate solution\n");
  for (j=0; j<n; ++j) {
    printf("%s%15.7g", j%3==0?"\n     ":"", (double)x[j]);
  }
  printf("\n");
  ftol = __cminpack_func__(dpmpar)(1);
#ifdef TEST_COVAR
  /* test the original covar from MINPACK */
  covfac = fnorm*fnorm/(m-n);
  memcpy(fjac1, fjac, sizeof(fjac));
  __cminpack_func__(covar)(n, fjac1, ldfjac, ipvt, ftol, wa1);
  /*
  printf("      covariance (using covar)\n");
  for (i=0; i<n; ++i) {
    for (j=0; j<n; ++j)
      printf("%s%15.7g", j%3==1?"\n     ":"", (double)fjac1[i*ldfjac+j]*covfac);
  }
  printf("\n");
  */
#endif
  /* test covar1, which also estimates the rank of the Jacobian */
  k = __cminpack_func__(covar1)(m, n, fnorm*fnorm, fjac, ldfjac, ipvt, ftol, wa1);
  printf("      covariance\n");
  for (i=0; i<n; ++i) {
    for (j=0; j<n; ++j)
      printf("%s%15.7g", j%3==0?"\n     ":"", (double)fjac[i*ldfjac+j]);
  }
  printf("\n");
  (void)k;
#ifdef TEST_COVAR
  if (k == n) {
    /* comparison only works if covariance matrix has full rank */
    for (i=0; i<n; ++i) {
      for (j=0; j<n; ++j) {
        if (fjac[i*ldfjac+j] != fjac1[i*ldfjac+j]*covfac) {
          printf("component (%d,%d) of covar and covar1 differ: %g != %g\n", i, j, (double)fjac[i*ldfjac+j], (double)(fjac1[i*ldfjac+j]*covfac));
        }
      }
    }
  }
#endif
  /* printf("      rank(J) = %d\n", k != 0 ? k : n); */
  return 0;
}